

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *X_00;
  bool bVar1;
  short sVar2;
  int iVar3;
  size_t A_limbs;
  size_t B_limbs;
  mbedtls_mpi *X_01;
  mbedtls_mpi *X_02;
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi local_50;
  mbedtls_mpi local_40;
  
  local_40.s = 1;
  local_40.n = 0;
  local_40.p = (mbedtls_mpi_uint *)0x0;
  local_50.s = 1;
  local_50.n = 0;
  local_50.p = (mbedtls_mpi_uint *)0x0;
  X_01 = A;
  if (X == A) {
    X_01 = &local_40;
    iVar3 = mbedtls_mpi_copy(X_01,A);
    if (iVar3 != 0) goto LAB_018b27f4;
  }
  X_02 = B;
  if (X == B) {
    X_02 = &local_50;
    iVar3 = mbedtls_mpi_copy(X_02,B);
    if (iVar3 != 0) goto LAB_018b27f4;
  }
  A_limbs = (size_t)X_01->n;
  bVar1 = true;
  if (A_limbs != 0) {
    do {
      if (X_01->p[A_limbs - 1] != 0) {
        bVar1 = false;
        goto LAB_018b279c;
      }
      A_limbs = A_limbs - 1;
    } while (A_limbs != 0);
    A_limbs = 0;
  }
LAB_018b279c:
  B_limbs = (size_t)X_02->n;
  if (B_limbs == 0) {
    bVar1 = false;
  }
  else {
    do {
      if (X_02->p[B_limbs - 1] != 0) goto LAB_018b27be;
      B_limbs = B_limbs - 1;
    } while (B_limbs != 0);
    bVar1 = true;
    B_limbs = 0;
LAB_018b27be:
    bVar1 = !bVar1;
  }
  iVar3 = mbedtls_mpi_grow(X,A_limbs + B_limbs);
  if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_grow(X,1), iVar3 == 0)) {
    iVar3 = 0;
    switchD_01306cb1::default(X->p,0,(ulong)X->n << 3);
    X_00 = X->p;
    *X_00 = 0;
    X->s = 1;
    mbedtls_mpi_core_mul(X_00,X_01->p,A_limbs,X_02->p,B_limbs);
    sVar2 = 1;
    if (bVar1) {
      sVar2 = X_02->s * X_01->s;
    }
    X->s = sVar2;
  }
LAB_018b27f4:
  if (local_50.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_50.p,(ulong)local_50.n << 3);
  }
  local_50.s = 1;
  local_50.n = 0;
  local_50.p = (mbedtls_mpi_uint *)0x0;
  if (local_40.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_40.p,(ulong)local_40.n << 3);
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_mul_mpi(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi TA, TB;
    int result_is_zero = 0;

    mbedtls_mpi_init(&TA);
    mbedtls_mpi_init(&TB);

    if (X == A) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TA, A)); A = &TA;
    }
    if (X == B) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, B)); B = &TB;
    }

    for (i = A->n; i > 0; i--) {
        if (A->p[i - 1] != 0) {
            break;
        }
    }
    if (i == 0) {
        result_is_zero = 1;
    }

    for (j = B->n; j > 0; j--) {
        if (B->p[j - 1] != 0) {
            break;
        }
    }
    if (j == 0) {
        result_is_zero = 1;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, i + j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

    mbedtls_mpi_core_mul(X->p, A->p, i, B->p, j);

    /* If the result is 0, we don't shortcut the operation, which reduces
     * but does not eliminate side channels leaking the zero-ness. We do
     * need to take care to set the sign bit properly since the library does
     * not fully support an MPI object with a value of 0 and s == -1. */
    if (result_is_zero) {
        X->s = 1;
    } else {
        X->s = A->s * B->s;
    }

cleanup:

    mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TA);

    return ret;
}